

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::add_sample
          (TypedTimeSamples<tinyusdz::value::AssetPath> *this,double t,AssetPath *v)

{
  Sample s;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  bool local_30;
  
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_30 = false;
  local_78 = (undefined1  [8])t;
  local_70._M_p = (pointer)&local_60;
  local_50._M_p = (pointer)&local_40;
  ::std::__cxx11::string::_M_assign((string *)&local_70);
  ::std::__cxx11::string::_M_assign((string *)&local_50);
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>>
              *)this,(Sample *)local_78);
  this->_dirty = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }